

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::IdentifierExpression::~IdentifierExpression(IdentifierExpression *this)

{
  IdentifierExpression *this_local;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__IdentifierExpression_0020ca68;
  std::shared_ptr<Lodtalk::VariableLookup>::~shared_ptr(&this->variable);
  std::__cxx11::string::~string((string *)&this->identifier);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

IdentifierExpression::~IdentifierExpression()
{
}